

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe50At2(uint8_t *buf)

{
  return (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0x3f) << 0x10) << 0x1c |
         (ulong)((uint)buf[4] << 0xc | (uint)buf[3] << 0x14) | (ulong)buf[5] << 4 |
         (ulong)(buf[6] >> 4);
}

Assistant:

std::uint64_t readFlUIntBe50At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 4;
    res |= (buf[6] >> 4);
    res &= UINT64_C(0x3ffffffffffff);
    return res;
}